

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_binary.c
# Opt level: O0

int write_header(archive_write *a,archive_entry *entry)

{
  archive_entry *paVar1;
  wchar_t wVar2;
  int iVar3;
  int iVar4;
  mode_t mVar5;
  uint uVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  dev_t dVar10;
  la_int64_t lVar11;
  time_t tVar12;
  size_t sVar13;
  size_t local_80;
  size_t len;
  archive_entry *entry_main;
  archive_string_conv *sconv;
  uint16_t local_60;
  uint16_t local_5e;
  uint16_t local_5c;
  cpio_binary_header h;
  int64_t ino;
  int local_38;
  int ret_final;
  int ret;
  int pathlength;
  char *path;
  char *p;
  cpio_conflict1 *cpio;
  archive_entry *entry_local;
  archive_write *a_local;
  
  p = (char *)a->format_data;
  ino._4_4_ = 0;
  cpio = (cpio_conflict1 *)entry;
  entry_local = (archive_entry *)a;
  entry_main = (archive_entry *)get_sconv(a);
  len = 0;
  wVar2 = _archive_entry_pathname_l
                    ((archive_entry *)cpio,(char **)&ret,&local_80,(archive_string_conv *)entry_main
                    );
  if (wVar2 != L'\0') {
    piVar7 = __errno_location();
    paVar1 = entry_local;
    if (*piVar7 == 0xc) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Pathname");
      ino._4_4_ = -0x1e;
      goto LAB_00178f59;
    }
    pcVar8 = archive_entry_pathname((archive_entry *)cpio);
    pcVar9 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error((archive *)paVar1,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar8,pcVar9)
    ;
    ino._4_4_ = -0x14;
  }
  iVar3 = (int)local_80 + 1;
  sconv._6_2_ = la_swap16(0x71c7);
  dVar10 = archive_entry_dev((archive_entry *)cpio);
  local_60 = la_swap16((uint16_t)dVar10);
  iVar4 = synthesize_ino_value((cpio_conflict1 *)p,(archive_entry *)cpio);
  h._18_8_ = SEXT48(iVar4);
  if ((long)h._18_8_ < 0) {
    archive_set_error((archive *)entry_local,0xc,"No memory for ino translation table");
    ino._4_4_ = -0x1e;
  }
  else if ((long)h._18_8_ < 0x8000) {
    local_5e = la_swap16((uint16_t)iVar4);
    mVar5 = archive_entry_mode((archive_entry *)cpio);
    local_5c = (uint16_t)mVar5;
    if (((mVar5 & 0xf000) == 0xc000) || ((mVar5 & 0xf000) == 0x1000)) {
      archive_set_error((archive *)entry_local,0x16,
                        "sockets and fifos cannot be represented in the binary cpio formats");
      ino._4_4_ = -0x1e;
    }
    else if ((entry_local->stat_valid == L'𐀇') && ((mVar5 & 0xf000) == 0xa000)) {
      archive_set_error((archive *)entry_local,0x16,
                        "symbolic links cannot be represented in the PWB cpio format");
      ino._4_4_ = -0x1e;
    }
    else {
      local_5c = la_swap16(local_5c);
      lVar11 = archive_entry_uid((archive_entry *)cpio);
      h.h_magic = la_swap16((uint16_t)lVar11);
      lVar11 = archive_entry_gid((archive_entry *)cpio);
      h.h_dev = la_swap16((uint16_t)lVar11);
      uVar6 = archive_entry_nlink((archive_entry *)cpio);
      h.h_ino = la_swap16((uint16_t)uVar6);
      mVar5 = archive_entry_filetype((archive_entry *)cpio);
      if ((mVar5 == 0x6000) ||
         (mVar5 = archive_entry_filetype((archive_entry *)cpio), mVar5 == 0x2000)) {
        dVar10 = archive_entry_rdev((archive_entry *)cpio);
        h.h_mode = la_swap16((uint16_t)dVar10);
      }
      else {
        h.h_mode = 0;
      }
      tVar12 = archive_entry_mtime((archive_entry *)cpio);
      h._8_4_ = la_swap32((uint32_t)tVar12);
      h.h_nlink = la_swap16((uint16_t)iVar3);
      mVar5 = archive_entry_filetype((archive_entry *)cpio);
      if (mVar5 != 0x8000) {
        archive_entry_set_size((archive_entry *)cpio,0);
      }
      wVar2 = _archive_entry_symlink_l
                        ((archive_entry *)cpio,&path,&local_80,(archive_string_conv *)entry_main);
      if (wVar2 != L'\0') {
        piVar7 = __errno_location();
        paVar1 = entry_local;
        if (*piVar7 == 0xc) {
          archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Linkname");
          ino._4_4_ = -0x1e;
          goto LAB_00178f59;
        }
        pcVar8 = archive_entry_symlink((archive_entry *)cpio);
        pcVar9 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
        archive_set_error((archive *)paVar1,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar8,
                          pcVar9);
        ino._4_4_ = -0x14;
      }
      if (((local_80 == 0) || (path == (char *)0x0)) || (*path == '\0')) {
        if ((entry_local->stat_valid == L'𐀇') &&
           (lVar11 = archive_entry_size((archive_entry *)cpio), 0xffffff < lVar11)) {
          archive_set_error((archive *)entry_local,0x22,
                            "File is too large for PWB binary cpio format.");
          ino._4_4_ = -0x19;
          goto LAB_00178f59;
        }
        lVar11 = archive_entry_size((archive_entry *)cpio);
        if (0x7fffffff < lVar11) {
          archive_set_error((archive *)entry_local,0x22,"File is too large for binary cpio format.")
          ;
          ino._4_4_ = -0x19;
          goto LAB_00178f59;
        }
        lVar11 = archive_entry_size((archive_entry *)cpio);
        h._14_4_ = la_swap32((uint32_t)lVar11);
      }
      else {
        if (entry_local->stat_valid == L'𐀇') {
          archive_set_error((archive *)entry_local,0x16,
                            "symlinks are not supported by UNIX V6 or by PWB cpio");
          ino._4_4_ = -0x1e;
          goto LAB_00178f59;
        }
        sVar13 = strlen(path);
        h._14_4_ = la_swap32((uint32_t)sVar13);
      }
      iVar4 = __archive_write_output((archive_write *)entry_local,(void *)((long)&sconv + 6),0x1a);
      if (iVar4 == 0) {
        local_38 = __archive_write_output((archive_write *)entry_local,_ret,(long)iVar3);
        if ((local_38 == 0) && (iVar3 % 2 != 0)) {
          local_38 = __archive_write_nulls((archive_write *)entry_local,1);
        }
        if (local_38 == 0) {
          lVar11 = archive_entry_size((archive_entry *)cpio);
          paVar1 = entry_local;
          pcVar8 = path;
          *(la_int64_t *)p = lVar11;
          if ((*(ulong *)p & 1) != 0) {
            *(long *)p = *(long *)p + 1;
          }
          if ((path != (char *)0x0) && (*path != '\0')) {
            sVar13 = strlen(path);
            local_38 = __archive_write_output((archive_write *)paVar1,pcVar8,sVar13);
            if ((local_38 == 0) && (sVar13 = strlen(path), (sVar13 & 1) != 0)) {
              local_38 = __archive_write_nulls((archive_write *)entry_local,1);
            }
            if (local_38 != 0) {
              ino._4_4_ = -0x1e;
            }
          }
        }
        else {
          ino._4_4_ = -0x1e;
        }
      }
      else {
        ino._4_4_ = -0x1e;
      }
    }
  }
  else {
    archive_set_error((archive *)entry_local,0x22,"Too many files for this cpio format");
    ino._4_4_ = -0x1e;
  }
LAB_00178f59:
  archive_entry_free((archive_entry *)len);
  return ino._4_4_;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	int64_t	ino;
	struct cpio_binary_header h;
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	/* Include trailing null */
	pathlength = (int)len + 1;

	h.h_magic = la_swap16(070707);
	h.h_dev = la_swap16(archive_entry_dev(entry));

	ino = synthesize_ino_value(cpio, entry);
	if (ino < 0) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for ino translation table");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	} else if (ino > 077777) {
		archive_set_error(&a->archive, ERANGE,
		    "Too many files for this cpio format");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	h.h_ino = la_swap16((uint16_t)ino);

	h.h_mode = archive_entry_mode(entry);
	if (((h.h_mode & AE_IFMT) == AE_IFSOCK) || ((h.h_mode & AE_IFMT) == AE_IFIFO)) {
		archive_set_error(&a->archive, EINVAL,
				  "sockets and fifos cannot be represented in the binary cpio formats");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_PWB) {
		if ((h.h_mode & AE_IFMT) == AE_IFLNK) {
			archive_set_error(&a->archive, EINVAL,
					  "symbolic links cannot be represented in the PWB cpio format");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		/* we could turn off AE_IFREG here, but it does no harm, */
		/* and allows v7 cpio to read the entry without confusion */
	}
	h.h_mode = la_swap16(h.h_mode);

	h.h_uid = la_swap16((uint16_t)archive_entry_uid(entry));
	h.h_gid = la_swap16((uint16_t)archive_entry_gid(entry));
	h.h_nlink = la_swap16((uint16_t)archive_entry_nlink(entry));

	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR)
		h.h_majmin = la_swap16(archive_entry_rdev(entry));
	else
		h.h_majmin = 0;

	h.h_mtime = la_swap32((uint32_t)archive_entry_mtime(entry));
	h.h_namesize = la_swap16(pathlength);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}

	if (len > 0 && p != NULL  &&  *p != '\0') {
		if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_PWB) {
			archive_set_error(&a->archive, EINVAL,
					  "symlinks are not supported by UNIX V6 or by PWB cpio");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		h.h_filesize = la_swap32((uint32_t)strlen(p)); /* symlink */
	} else {
		if ((a->archive.archive_format == ARCHIVE_FORMAT_CPIO_PWB) &&
		    (archive_entry_size(entry) > 256*256*256-1)) {
			archive_set_error(&a->archive, ERANGE,
					  "File is too large for PWB binary cpio format.");
			ret_final = ARCHIVE_FAILED;
			goto exit_write_header;
		} else if (archive_entry_size(entry) > INT32_MAX) {
			archive_set_error(&a->archive, ERANGE,
					  "File is too large for binary cpio format.");
			ret_final = ARCHIVE_FAILED;
			goto exit_write_header;
		}
		h.h_filesize = la_swap32((uint32_t)archive_entry_size(entry)); /* file */
	}

	ret = __archive_write_output(a, &h, HSIZE);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, path, pathlength);
	if ((ret == ARCHIVE_OK) && ((pathlength % 2) != 0))
		ret = __archive_write_nulls(a, 1);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);
	if ((cpio->entry_bytes_remaining % 2) != 0)
		cpio->entry_bytes_remaining++;

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if ((ret == ARCHIVE_OK) && ((strlen(p) % 2) != 0))
			ret = __archive_write_nulls(a, 1);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}

exit_write_header:
	archive_entry_free(entry_main);
	return (ret_final);
}